

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

Vec_Int_t * assignRandomBitsToCells(Abc_Ntk_t *pNtk,coloring *c)

{
  uint uVar1;
  Vec_Int_t *p;
  int iVar2;
  
  p = Vec_IntAlloc((int)pNtk);
  for (iVar2 = 0; iVar2 < pNtk->vPis->nSize;
      iVar2 = iVar2 + c->clen[(long)iVar2 + (long)pNtk->vPos->nSize] + 1) {
    rand();
    rand();
    uVar1 = rand();
    Vec_IntPush(p,uVar1 & 1);
  }
  return p;
}

Assistant:

static Vec_Int_t * 
assignRandomBitsToCells(Abc_Ntk_t * pNtk, struct coloring *c)
{
    Vec_Int_t * randVec = Vec_IntAlloc( 1 );
    int i, bit;

    for (i = 0; i < Abc_NtkPiNum(pNtk); i += (c->clen[i+Abc_NtkPoNum(pNtk)]+1)) {
        bit = (int)(SIM_RANDOM_UNSIGNED % 2);
        Vec_IntPush(randVec, bit);
    }

    return randVec;
}